

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O0

member_function_pointer<void,_void,_void,_void> * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>::
allocate_array(memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>
               *this,unsigned_long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  member_function_pointer<void,_void,_void,_void> *pmVar4;
  ulong in_RSI;
  ulong uVar5;
  member_function_pointer<void,_void,_void,_void> *local_40;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x40),0);
  uVar5 = uVar2 + 0x10;
  if (SUB168(auVar1 * ZEXT816(0x40),8) != 0 || 0xffffffffffffffef < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar5);
  *(ulong *)((long)pvVar3 + 8) = in_RSI;
  pmVar4 = (member_function_pointer<void,_void,_void,_void> *)((long)pvVar3 + 0x10);
  if (in_RSI != 0) {
    local_40 = pmVar4;
    do {
      member_function_pointer<void,_void,_void,_void>::member_function_pointer
                ((member_function_pointer<void,_void,_void,_void> *)0x48acaf);
      local_40 = local_40 + 1;
    } while (local_40 != pmVar4 + in_RSI);
  }
  return pmVar4;
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }